

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

void crnlib::etc1_block::unpack_color4(uint *r,uint *g,uint *b,uint16 packed_color4,bool scaled)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined3 in_register_00000081;
  uint uVar6;
  
  uVar3 = packed_color4 & 0xf;
  uVar6 = packed_color4 >> 4 & 0xf;
  uVar4 = packed_color4 >> 8 & 0xf;
  uVar5 = uVar4 << 4 | uVar4;
  uVar1 = uVar3 << 4 | uVar3;
  uVar2 = uVar6 << 4 | uVar6;
  if (CONCAT31(in_register_00000081,scaled) == 0) {
    uVar5 = uVar4;
    uVar1 = uVar3;
    uVar2 = uVar6;
  }
  *r = uVar5;
  *g = uVar2;
  *b = uVar1;
  return;
}

Assistant:

color_quad_u8 etc1_block::unpack_color4(uint16 packed_color4, bool scaled, uint alpha) {
  uint b = packed_color4 & 15U;
  uint g = (packed_color4 >> 4U) & 15U;
  uint r = (packed_color4 >> 8U) & 15U;

  if (scaled) {
    b = (b << 4U) | b;
    g = (g << 4U) | g;
    r = (r << 4U) | r;
  }

  return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
}